

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

void __thiscall
sf::RenderTarget::draw
          (RenderTarget *this,Vertex *vertices,size_t vertexCount,PrimitiveType type,
          RenderStates *states)

{
  Vector2f *pVVar1;
  bool bVar2;
  uint uVar3;
  Vector2f VVar4;
  bool local_71;
  char *data_1;
  char *data;
  bool enableTexCoordsArray;
  Vertex *vertex;
  size_t i;
  bool useVertexCache;
  RenderStates *states_local;
  PrimitiveType type_local;
  size_t vertexCount_local;
  Vertex *vertices_local;
  RenderTarget *this_local;
  
  if (((vertices != (Vertex *)0x0) && (vertexCount != 0)) &&
     ((bVar2 = anon_unknown.dwarf_c483c::isActive(this->m_id), bVar2 ||
      (uVar3 = (*this->_vptr_RenderTarget[3])(this,1), (uVar3 & 1) != 0)))) {
    bVar2 = vertexCount < 5;
    if (bVar2) {
      for (vertex = (Vertex *)0x0; vertex < vertexCount;
          vertex = (Vertex *)((long)&(vertex->position).x + 1)) {
        pVVar1 = (Vector2f *)(&(this->m_cache).field_0x2c + (long)vertex * 0x14);
        VVar4 = sf::operator*(&states->transform,&vertices[(long)vertex].position);
        *pVVar1 = VVar4;
        pVVar1[1].x = (float)vertices[(long)vertex].color;
        *(Vector2f *)&pVVar1[1].y = vertices[(long)vertex].texCoords;
      }
    }
    setupDraw(this,bVar2,states);
    local_71 = true;
    if (states->texture == (Texture *)0x0) {
      local_71 = states->shader != (Shader *)0x0;
    }
    if ((((this->m_cache).enable & 1U) == 0) ||
       (local_71 != (bool)((this->m_cache).texCoordsArrayEnabled & 1U))) {
      if (local_71 == false) {
        glDisableClientState(0x8078);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                           ,0x120,"glDisableClientState(GL_TEXTURE_COORD_ARRAY)");
      }
      else {
        glEnableClientState(0x8078);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                           ,0x11e,"glEnableClientState(GL_TEXTURE_COORD_ARRAY)");
      }
    }
    if (((((this->m_cache).enable & 1U) == 0) || (!bVar2)) ||
       (((this->m_cache).useVertexCache & 1U) == 0)) {
      data_1 = (char *)vertices;
      if (bVar2) {
        data_1 = &(this->m_cache).field_0x2c;
      }
      glVertexPointer(2,0x1406,0x14,data_1);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                         ,0x12d,"glVertexPointer(2, GL_FLOAT, sizeof(Vertex), data + 0)");
      glColorPointer(4,0x1401,0x14,data_1 + 8);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                         ,0x12e,"glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(Vertex), data + 8)");
      if (local_71 != false) {
        glTexCoordPointer(2,0x1406,0x14,data_1 + 0xc);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                           ,0x130,"glTexCoordPointer(2, GL_FLOAT, sizeof(Vertex), data + 12)");
      }
    }
    else if ((local_71 != false) && (((this->m_cache).texCoordsArrayEnabled & 1U) == 0)) {
      glTexCoordPointer(2,0x1406,0x14,&(this->m_cache).field_0x38);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                         ,0x137,"glTexCoordPointer(2, GL_FLOAT, sizeof(Vertex), data + 12)");
    }
    drawPrimitives(this,type,0,vertexCount);
    cleanupDraw(this,states);
    (this->m_cache).useVertexCache = bVar2;
    (this->m_cache).texCoordsArrayEnabled = local_71;
  }
  return;
}

Assistant:

void RenderTarget::draw(const Vertex* vertices, std::size_t vertexCount,
                        PrimitiveType type, const RenderStates& states)
{
    // Nothing to draw?
    if (!vertices || (vertexCount == 0))
        return;

    // GL_QUADS is unavailable on OpenGL ES
    #ifdef SFML_OPENGL_ES
        if (type == Quads)
        {
            err() << "sf::Quads primitive type is not supported on OpenGL ES platforms, drawing skipped" << std::endl;
            return;
        }
    #endif

    if (isActive(m_id) || setActive(true))
    {
        // Check if the vertex count is low enough so that we can pre-transform them
        bool useVertexCache = (vertexCount <= StatesCache::VertexCacheSize);

        if (useVertexCache)
        {
            // Pre-transform the vertices and store them into the vertex cache
            for (std::size_t i = 0; i < vertexCount; ++i)
            {
                Vertex& vertex = m_cache.vertexCache[i];
                vertex.position = states.transform * vertices[i].position;
                vertex.color = vertices[i].color;
                vertex.texCoords = vertices[i].texCoords;
            }
        }

        setupDraw(useVertexCache, states);

        // Check if texture coordinates array is needed, and update client state accordingly
        bool enableTexCoordsArray = (states.texture || states.shader);
        if (!m_cache.enable || (enableTexCoordsArray != m_cache.texCoordsArrayEnabled))
        {
            if (enableTexCoordsArray)
                glCheck(glEnableClientState(GL_TEXTURE_COORD_ARRAY));
            else
                glCheck(glDisableClientState(GL_TEXTURE_COORD_ARRAY));
        }

        // If we switch between non-cache and cache mode or enable texture
        // coordinates we need to set up the pointers to the vertices' components
        if (!m_cache.enable || !useVertexCache || !m_cache.useVertexCache)
        {
            const char* data = reinterpret_cast<const char*>(vertices);

            // If we pre-transform the vertices, we must use our internal vertex cache
            if (useVertexCache)
                data = reinterpret_cast<const char*>(m_cache.vertexCache);

            glCheck(glVertexPointer(2, GL_FLOAT, sizeof(Vertex), data + 0));
            glCheck(glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(Vertex), data + 8));
            if (enableTexCoordsArray)
                glCheck(glTexCoordPointer(2, GL_FLOAT, sizeof(Vertex), data + 12));
        }
        else if (enableTexCoordsArray && !m_cache.texCoordsArrayEnabled)
        {
            // If we enter this block, we are already using our internal vertex cache
            const char* data = reinterpret_cast<const char*>(m_cache.vertexCache);

            glCheck(glTexCoordPointer(2, GL_FLOAT, sizeof(Vertex), data + 12));
        }

        drawPrimitives(type, 0, vertexCount);
        cleanupDraw(states);

        // Update the cache
        m_cache.useVertexCache = useVertexCache;
        m_cache.texCoordsArrayEnabled = enableTexCoordsArray;
    }
}